

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall
CQueue::
AddToQueue<int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_int_char_data_ptr_char_data_ptr_int_int_bool_int_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char_data **args_1,int *args_2,int *args_3,int *args_4,int *args_5,
          int *args_6,char (*args_7) [18])

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  char_data *pcVar6;
  char_data *pcVar7;
  undefined8 uVar8;
  string *args_00;
  string_view fmt;
  string_view fmt_00;
  tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]> tuple;
  int local_120;
  int local_11c;
  string *local_118;
  string *local_110;
  CQueue *local_108;
  _func_int_char_data_ptr_char_data_ptr_int_int_bool_int_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_100;
  vector<char_data_*,_std::allocator<char_data_*>_> local_f8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<char_data_*,_std::allocator<char_data_*>_> local_98;
  _Any_data local_80;
  _Manager_type local_70;
  _Invoker_type p_Stack_68;
  tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]> local_60;
  
  local_120 = nTimer;
  local_100 = func;
  if (nTimer < 0) {
    local_e0 = (undefined1  [8])0x8;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_e0);
  }
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<5UL,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<6UL,_int,_const_char_(&)[18]>.super__Tuple_impl<7UL,_const_char_(&)[18]>.
  super__Head_base<7UL,_const_char_(&)[18],_false>._M_head_impl =
       (_Head_base<7UL,_const_char_(&)[18],_false>)
       (_Head_base<7UL,_const_char_(&)[18],_false>)args_7;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<5UL,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<6UL,_int,_const_char_(&)[18]>.super__Head_base<6UL,_int,_false>._M_head_impl =
       *args_6;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<5UL,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<6UL,_int,_const_char_(&)[18]>._12_4_ = *args_5;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>.super__Head_base<4UL,_int,_false>.
  _M_head_impl = *args_4;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<4UL,_int,_int,_int,_const_char_(&)[18]>._20_4_ = *args_3;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<2UL,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Head_base<2UL,_int_&,_false>._M_head_impl = args_2;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Tuple_impl<1UL,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Head_base<1UL,_char_data_*&,_false>._M_head_impl = args_1;
  local_60.
  super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>
            (&local_f8,this,&local_60);
  local_e0._0_4_ = local_120;
  local_d8._M_p = (pointer)&local_c8;
  pcVar5 = (from->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar5,pcVar5 + from->_M_string_length);
  local_b8._M_p = (pointer)&local_a8;
  pcVar5 = (funcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar5,pcVar5 + funcName->_M_string_length);
  local_118 = funcName;
  local_110 = from;
  local_108 = this;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_98,&local_f8);
  pcVar6 = *args;
  pcVar7 = *args_1;
  local_11c = *args_2;
  iVar1 = *args_3;
  iVar2 = *args_4;
  iVar3 = *args_5;
  iVar4 = *args_6;
  local_70 = (_Manager_type)0x0;
  p_Stack_68 = (_Invoker_type)0x0;
  local_80._M_unused._M_object = (void *)0x0;
  local_80._8_8_ = 0;
  local_80._M_unused._M_object = operator_new(0x40);
  *(_func_int_char_data_ptr_char_data_ptr_int_int_bool_int_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
    **)local_80._M_unused._0_8_ = local_100;
  *(char_data **)((long)local_80._M_unused._0_8_ + 8) = pcVar6;
  *(char_data **)((long)local_80._M_unused._0_8_ + 0x10) = pcVar7;
  *(int *)((long)local_80._M_unused._0_8_ + 0x18) = local_11c;
  *(int *)((long)local_80._M_unused._0_8_ + 0x1c) = iVar1;
  *(int *)((long)local_80._M_unused._0_8_ + 0x20) = iVar2;
  *(int *)((long)local_80._M_unused._0_8_ + 0x24) = iVar3;
  *(int *)((long)local_80._M_unused._0_8_ + 0x28) = iVar4;
  uVar8 = *(undefined8 *)(*args_7 + 8);
  *(undefined8 *)((long)local_80._M_unused._0_8_ + 0x2c) = *(undefined8 *)*args_7;
  *(undefined8 *)((long)local_80._M_unused._0_8_ + 0x34) = uVar8;
  *(undefined2 *)((long)local_80._M_unused._0_8_ + 0x3c) = *(undefined2 *)(*args_7 + 0x10);
  p_Stack_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/characterClasses/../queue.h:45:52)>
               ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/characterClasses/../queue.h:45:52)>
             ::_M_manager;
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&local_108->newQueue,(queueEntry_t *)local_e0);
  args_00 = local_110;
  if (local_70 != (_Manager_type)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_98.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,args_00,local_118,&local_120);
  if (local_f8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}